

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O0

void __thiscall
QMenuBarPrivate::popupAction(QMenuBarPrivate *this,QAction *action,bool activateFirst)

{
  bool bVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  QWidget *rect;
  QMenu *pQVar9;
  ulong uVar10;
  QPoint *pQVar11;
  int *piVar12;
  byte in_DL;
  long in_RSI;
  QMenuBarPrivate *in_RDI;
  long in_FS_OFFSET;
  bool shouldShiftToRight;
  int actionWidth;
  bool rtl;
  bool fitDown;
  bool fitUp;
  QScreen *menubarScreen;
  QMenuPrivate *activeMenuPriv;
  QMenuBar *q;
  QRect screenRect;
  QPoint pos;
  QSize popup_size;
  QPointer<QScreen> popupScreen;
  QPoint screenTestPos;
  QPoint popupPos;
  QRect adjustedActionRect;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  QWidgetPrivate *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  QWidget *in_stack_fffffffffffffea0;
  QWidget *this_00;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  byte local_101;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  undefined8 local_90;
  undefined1 local_88 [16];
  QPoint local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  QPoint local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  QPoint local_40;
  QPoint local_38;
  QPoint local_28;
  QPoint local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  rect = &q_func(in_RDI)->super_QWidget;
  if (in_RSI == 0) goto LAB_0065b676;
  pQVar9 = QAction::menu<QMenu*>((QAction *)0x65ae69);
  auVar2._8_8_ = local_88._8_8_;
  auVar2._0_8_ = local_88._0_8_;
  if ((pQVar9 == (QMenu *)0x0) || (local_88 = auVar2, ((byte)in_RDI->field_0x298 >> 1 & 1) != 0))
  goto LAB_0065b676;
  in_RDI->field_0x2a0 = in_RDI->field_0x2a0 & 0xfe | 1;
  uVar10 = QAction::isEnabled();
  if ((uVar10 & 1) != 0) {
    QAction::menu<QMenu*>((QAction *)0x65aec5);
    bVar3 = QWidget::isEnabled((QWidget *)0x65aecd);
    if (bVar3) {
      in_RDI->field_0x298 = in_RDI->field_0x298 & 0xfd;
      QAction::menu<QMenu*>((QAction *)0x65aefa);
      QPointer<QMenu>::operator=
                ((QPointer<QMenu> *)in_stack_fffffffffffffe90,
                 (QMenu *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      QPointer<QMenu>::operator->((QPointer<QMenu> *)0x65af1f);
      QMenu::d_func((QMenu *)0x65af27);
      QPointer<QWidget>::operator=
                ((QPointer<QWidget> *)in_stack_fffffffffffffe90,
                 (QWidget *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      QPointer<QAction>::operator=
                ((QPointer<QAction> *)in_stack_fffffffffffffe90,
                 (QAction *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = (undefined1  [16])
                 actionRect((QMenuBarPrivate *)
                            CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                            (QAction *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                           );
      local_20 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      local_28 = QRect::bottomLeft((QRect *)CONCAT44(in_stack_fffffffffffffe8c,
                                                     in_stack_fffffffffffffe88));
      QPoint::QPoint((QPoint *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                     in_stack_fffffffffffffe88);
      local_20 = ::operator+((QPoint *)in_stack_fffffffffffffea0,
                             (QPoint *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)
                            );
      QWidget::window(in_stack_fffffffffffffea0);
      QWidget::windowHandle((QWidget *)in_stack_fffffffffffffe90);
      pQVar11 = (QPoint *)QWindow::screen();
      local_38 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      QPoint::QPoint((QPoint *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                     in_stack_fffffffffffffe88);
      local_40 = ::operator+((QPoint *)in_stack_fffffffffffffea0,
                             (QPoint *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)
                            );
      local_60 = QWidget::mapToGlobal
                           (in_stack_fffffffffffffea0,
                            (QPoint *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
      ;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = local_60;
      QScreen::virtualSiblingAt(pQVar11);
      QPointer<QScreen>::QPointer<void>
                ((QPointer<QScreen> *)in_stack_fffffffffffffe90,
                 (QScreen *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QScreen> *)0x65b0fe);
      if (!bVar3) {
        QPointer<QScreen>::operator=
                  ((QPointer<QScreen> *)in_stack_fffffffffffffe90,
                   (QScreen *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      }
      std::swap<QPointer<QScreen>>
                ((QPointer<QScreen> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (QPointer<QScreen> *)in_stack_fffffffffffffe90);
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar9 = QPointer<QMenu>::operator->((QPointer<QMenu> *)0x65b153);
      local_68 = (undefined1 *)(**(code **)(*(long *)&pQVar9->super_QWidget + 0x70))();
      std::swap<QPointer<QScreen>>
                ((QPointer<QScreen> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (QPointer<QScreen> *)in_stack_fffffffffffffe90);
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = QWidget::mapToGlobal
                           (in_stack_fffffffffffffea0,
                            (QPoint *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
      ;
      QPoint::x((QPoint *)0x65b1b9);
      QPoint::y((QPoint *)0x65b1ca);
      QPoint::QPoint((QPoint *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                     in_stack_fffffffffffffe88);
      local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QPointer<QScreen>::operator->((QPointer<QScreen> *)0x65b208);
      local_88 = QScreen::geometry();
      local_94 = QPoint::x((QPoint *)0x65b22d);
      local_98 = QRect::x((QRect *)0x65b241);
      qMax<int>(&local_94,&local_98);
      local_9c = QPoint::y((QPoint *)0x65b270);
      local_a0 = QRect::y((QRect *)0x65b284);
      qMax<int>(&local_9c,&local_a0);
      QPoint::QPoint((QPoint *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                     in_stack_fffffffffffffe88);
      local_70 = (undefined1 *)local_90;
      iVar5 = QPoint::y((QPoint *)0x65b2d0);
      iVar6 = QSize::height((QSize *)0x65b2e1);
      iVar7 = QRect::top((QRect *)0x65b2fa);
      bVar3 = iVar7 <= iVar5 - iVar6;
      iVar5 = QPoint::y((QPoint *)0x65b318);
      iVar6 = QSize::height((QSize *)0x65b329);
      iVar7 = QRect::bottom((QRect *)0x65b342);
      bVar1 = iVar5 + iVar6 <= iVar7;
      bVar4 = QWidget::isRightToLeft((QWidget *)0x65b360);
      iVar5 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      if ((bVar3) || (bVar1)) {
        if (bVar4) {
          piVar12 = QPoint::rx((QPoint *)0x65b4cc);
          *piVar12 = iVar5 + *piVar12;
          in_stack_fffffffffffffeac = iVar5;
        }
      }
      else {
        local_101 = (bVar4 ^ 0xffU) & 1;
        if (bVar4) {
          iVar6 = QSize::width((QSize *)0x65b3ad);
          iVar7 = QPoint::x((QPoint *)0x65b3be);
          if (iVar6 <= iVar7) goto LAB_0065b3cf;
          local_101 = 1;
        }
        else {
LAB_0065b3cf:
          iVar6 = QSize::width((QSize *)0x65b3e4);
          iVar7 = QPoint::x((QPoint *)0x65b3fd);
          iVar8 = QRect::right((QRect *)0x65b416);
          if (iVar8 < iVar5 + iVar6 + iVar7) {
            local_101 = 0;
          }
        }
        if (local_101 == 0) {
          if (!bVar4) {
            in_stack_fffffffffffffeb0 = QSize::width((QSize *)0x65b491);
            piVar12 = QPoint::rx((QPoint *)0x65b4a2);
            *piVar12 = *piVar12 - in_stack_fffffffffffffeb0;
          }
        }
        else {
          if (bVar4) {
            in_stack_fffffffffffffeb8 = QSize::width((QSize *)0x65b44a);
          }
          else {
            in_stack_fffffffffffffeb8 = 0;
          }
          in_stack_fffffffffffffeb4 = iVar5 + in_stack_fffffffffffffeb8;
          piVar12 = QPoint::rx((QPoint *)0x65b473);
          *piVar12 = in_stack_fffffffffffffeb4 + *piVar12;
          in_stack_fffffffffffffebc = iVar5;
        }
      }
      if ((in_RDI->defaultPopDown == 0) || ((bVar3 && (!bVar1)))) {
        local_a4 = QRect::y((QRect *)0x65b507);
        this_00 = rect;
        in_stack_fffffffffffffe9c = QRect::top((QRect *)0x65b528);
        QSize::height((QSize *)0x65b539);
        QPoint::QPoint((QPoint *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                       in_stack_fffffffffffffe88);
        QWidget::mapToGlobal
                  (this_00,(QPoint *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        local_a8 = QPoint::y((QPoint *)0x65b575);
        qMax<int>(&local_a4,&local_a8);
        QPoint::setY((QPoint *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      }
      ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x65b5b1);
      QMenuPrivate::get((QMenu *)0x65b5b9);
      QWidgetPrivate::topData(in_stack_fffffffffffffe90);
      QPointer<QScreen>::operator=
                ((QPointer<QScreen> *)in_stack_fffffffffffffe90,
                 (QPointer<QScreen> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))
      ;
      QPointer<QMenu>::operator->((QPointer<QMenu> *)0x65b5e9);
      QMenu::popup((QMenu *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   (QPoint *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (QAction *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      if ((in_DL & 1) != 0) {
        QPointer<QMenu>::operator->((QPointer<QMenu> *)0x65b618);
        QMenu::d_func((QMenu *)0x65b620);
        QMenuPrivate::setFirstActionActive
                  ((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
      QPointer<QScreen>::~QPointer((QPointer<QScreen> *)0x65b635);
    }
  }
  actionRect((QMenuBarPrivate *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (QAction *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                  (QRect *)rect);
LAB_0065b676:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuBarPrivate::popupAction(QAction *action, bool activateFirst)
{
    Q_Q(QMenuBar);
    if (!action || !action->menu() || closePopupMode)
        return;
    popupState = true;
    if (action->isEnabled() && action->menu()->isEnabled()) {
        closePopupMode = 0;
        activeMenu = action->menu();
        auto *activeMenuPriv = activeMenu->d_func();
        activeMenuPriv->causedPopup.widget = q;
        activeMenuPriv->causedPopup.action = action;

        QRect adjustedActionRect = actionRect(action);
        QPoint popupPos = adjustedActionRect.bottomLeft() + QPoint(0, 1);

        //we put the popup menu on the screen containing the bottom-center of the action rect
        QScreen *menubarScreen = q->window()->windowHandle()->screen();
        QPoint screenTestPos = q->mapToGlobal(popupPos + QPoint(adjustedActionRect.width() / 2, 0));
        QPointer<QScreen> popupScreen = menubarScreen->virtualSiblingAt(screenTestPos);
        if (!popupScreen)
            popupScreen = menubarScreen;
        std::swap(popupScreen, activeMenuPriv->popupScreen);
        const QSize popup_size = activeMenu->sizeHint();
        std::swap(popupScreen, activeMenuPriv->popupScreen);

        // Use screenTestPos.y() for the popup y position. This is the correct global y
        // consistent with the selected screen in cases where the action rect spans
        // multiple screens with different scale factors.
        QPoint pos(q->mapToGlobal(popupPos).x(), screenTestPos.y());

        QRect screenRect = popupScreen->geometry();
        pos = QPoint(qMax(pos.x(), screenRect.x()), qMax(pos.y(), screenRect.y()));
        const bool fitUp = (pos.y() - popup_size.height() >= screenRect.top());
        const bool fitDown = (pos.y() + popup_size.height() <= screenRect.bottom());
        const bool rtl = q->isRightToLeft();
        const int actionWidth = adjustedActionRect.width();

        if (!fitUp && !fitDown) { //we should shift the menu
            bool shouldShiftToRight = !rtl;
            if (rtl && popup_size.width() > pos.x())
                shouldShiftToRight = true;
            else if (actionWidth + popup_size.width() + pos.x() > screenRect.right())
                shouldShiftToRight = false;

            if (shouldShiftToRight) {
                pos.rx() += actionWidth + (rtl ? popup_size.width() : 0);
            } else {
                //shift to left
                if (!rtl)
                    pos.rx() -= popup_size.width();
            }
        } else if (rtl) {
            pos.rx() += actionWidth;
        }

        if (!defaultPopDown || (fitUp && !fitDown))
            pos.setY(qMax(screenRect.y(), q->mapToGlobal(QPoint(0, adjustedActionRect.top()-popup_size.height())).y()));
        QMenuPrivate::get(activeMenu)->topData()->initialScreen = popupScreen;
        activeMenu->popup(pos);
        if (activateFirst)
            activeMenu->d_func()->setFirstActionActive();
    }
    q->update(actionRect(action));
}